

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_true,_true>::insert_edge_(DaTrie<true,_true,_true> *this,Query *query)

{
  pointer pBVar1;
  pointer pNVar2;
  uint uVar3;
  ulong uVar4;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((uint)(byte)query->key_[query->pos_] ^
                 *(uint *)(pBVar1 + query->node_pos_) & 0x7fffffff);
  if ((long)pBVar1[uVar4] < 0) {
    solve_(this,query);
    uVar4 = (ulong)((uint)(byte)query->key_[query->pos_] ^
                   *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_start + query->node_pos_) &
                   0x7fffffff);
  }
  fix_(this,(uint32_t)uVar4,&this->blocks_);
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1[uVar4] =
       (Bc)((ulong)pBVar1[uVar4] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  pNVar2 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((uint)pNVar2[query->node_pos_].child ^
          *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_start + query->node_pos_)) * 2;
  pNVar2[uVar4].sib = (&pNVar2->sib)[uVar3];
  (&pNVar2->sib)[uVar3] = query->key_[query->pos_];
  query->node_pos_ = (uint32_t)uVar4;
  Query::next(query);
  return;
}

Assistant:

void insert_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (bc_[child_pos].is_fixed()) {
      solve_(query);
      child_pos = bc_[query.node_pos()].base() ^ query.label();
    }

    fix_(child_pos, blocks_);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      auto _child_pos = bc_[query.node_pos()].base() ^node_links_[query.node_pos()].child;
      node_links_[child_pos].sib = node_links_[_child_pos].sib;
      node_links_[_child_pos].sib = query.label();
    }
    query.next(child_pos);
  }